

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_interface.h
# Opt level: O3

strong_type<std::variant<int,_int>,_void,_ezy::features::result_like_continuation> * __thiscall
ezy::features::result_interface<ezy::features::result_adapter>::
impl<ezy::strong_type<std::variant<int,int>,void,ezy::features::result_like_continuation>>::
map<____C_A_T_C_H____T_E_S_T____28()::__0&>
          (strong_type<std::variant<int,_int>,_void,_ezy::features::result_like_continuation>
           *__return_storage_ptr__,void *this,anon_class_1_0_00000001 *fn)

{
  uint *puVar1;
  strong_type<std::variant<int,_int>,_void,_ezy::features::result_like_continuation> *psVar2;
  variant_alternative_t<0UL,_variant<int,_int>_> *pvVar3;
  
  if (*(__index_type *)
       ((long)&(__return_storage_ptr__->super_strong_type_base<std::variant<int,_int>,_true>).
               super_strong_type_payload<std::variant<int,_int>,_true>._value.
               super__Variant_base<int,_int>.super__Move_assign_alias<int,_int>.
               super__Copy_assign_alias<int,_int>.super__Move_ctor_alias<int,_int> + 4) == '\0') {
    pvVar3 = std::get<0ul,int,int>((variant<int,_int> *)__return_storage_ptr__);
    psVar2 = (strong_type<std::variant<int,_int>,_void,_ezy::features::result_like_continuation> *)
             (ulong)(uint)(*pvVar3 * 2);
  }
  else {
    puVar1 = (uint *)std::get<1ul,int,int>((variant<int,_int> *)__return_storage_ptr__);
    psVar2 = (strong_type<std::variant<int,_int>,_void,_ezy::features::result_like_continuation> *)
             ((ulong)*puVar1 | 0x100000000);
  }
  return psVar2;
}

Assistant:

constexpr decltype(auto) map(Fn&& fn) &&
      {
        return _impl::map(static_cast<T&&>(*this), std::forward<Fn>(fn));
      }